

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

xpath_string *
pugi::impl::anon_unknown_0::xpath_string::from_heap
          (xpath_string *__return_storage_ptr__,char_t *begin,char_t *end,xpath_allocator *alloc)

{
  char_t *__dest;
  size_t __n;
  
  if (end < begin) {
    __assert_fail("begin <= end",
                  "/workspace/llm4binary/github/license_c_cmakelists/dfranx[P]PluginShadertoy/libs/pugixml/src/pugixml.cpp"
                  ,0x1e8f,
                  "static xpath_string pugi::impl::(anonymous namespace)::xpath_string::from_heap(const char_t *, const char_t *, xpath_allocator *)"
                 );
  }
  if (begin != end) {
    __n = (long)end - (long)begin;
    __dest = (char_t *)xpath_allocator::allocate(alloc,__n + 1);
    if (__dest == (char_t *)0x0) {
      __dest = (char_t *)0x0;
    }
    else {
      memcpy(__dest,begin,__n);
      __dest[__n] = '\0';
    }
    if (__dest != (char_t *)0x0) {
      __return_storage_ptr__->_buffer = __dest;
      __return_storage_ptr__->_uses_heap = true;
      __return_storage_ptr__->_length_heap = __n;
      return __return_storage_ptr__;
    }
  }
  __return_storage_ptr__->_buffer = "";
  __return_storage_ptr__->_uses_heap = false;
  __return_storage_ptr__->_length_heap = 0;
  return __return_storage_ptr__;
}

Assistant:

static xpath_string from_heap(const char_t* begin, const char_t* end, xpath_allocator* alloc)
		{
			assert(begin <= end);

			if (begin == end)
				return xpath_string();

			size_t length = static_cast<size_t>(end - begin);
			const char_t* data = duplicate_string(begin, length, alloc);

			return data ? xpath_string(data, true, length) : xpath_string();
		}